

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device6.c
# Opt level: O2

void device6(void *arg)

{
  int line;
  int line_00;
  int iVar1;
  char *in_RCX;
  int sock;
  int sock_00;
  
  line = test_socket_impl((char *)0x3f,2,99,(int)in_RCX);
  test_connect_impl((char *)0x40,line,0x1041a0,in_RCX);
  line_00 = test_socket_impl((char *)0x41,2,0x62,(int)in_RCX);
  test_bind_impl((char *)0x42,line_00,0x104220,in_RCX);
  iVar1 = nn_device(line,line_00);
  if (iVar1 < 0) {
    iVar1 = nn_errno();
    if (iVar1 == 9) {
      test_close_impl((char *)0x49,line,sock);
      test_close_impl((char *)0x4a,line_00,sock_00);
      return;
    }
  }
  nn_backtrace_print();
  fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","rc < 0 && nn_errno () == EBADF",
          "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/device6.c",0x46
         );
  fflush(_stderr);
  nn_err_abort();
}

Assistant:

void device6 (NN_UNUSED void *arg)
{
    int rc;
    int dev2;
    int dev3;

    dev2 = test_socket (AF_SP_RAW, NN_RESPONDENT);
    test_connect (dev2, socket_address_i);
    dev3 = test_socket (AF_SP_RAW, NN_SURVEYOR);
    test_bind (dev3, socket_address_j);

    /*  Run the device. */
    rc = nn_device (dev2, dev3);
    nn_assert (rc < 0 && nn_errno () == EBADF);

    /*  Clean up. */
    test_close (dev2);
    test_close (dev3);
}